

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
 __thiscall ninx::parser::Parser::parse_function_argument(Parser *this)

{
  int iVar1;
  Token *token;
  Variable *this_00;
  string *psVar2;
  ParserException *this_01;
  string *in_RSI;
  undefined1 local_50 [8];
  string local_48;
  
  psVar2 = in_RSI + 1;
  token = TokenReader::get_token((TokenReader *)psVar2);
  iVar1 = (*token->_vptr_Token[2])(token);
  if (iVar1 == 3) {
    local_48._M_dataplus._M_p = (pointer)0x0;
    iVar1 = TokenReader::check_limiter((TokenReader *)psVar2,'=');
    if (iVar1 != 0) {
      TokenReader::get_token((TokenReader *)psVar2);
      parse_level_3_expression((Parser *)local_50);
      local_48._M_dataplus._M_p = (pointer)local_50;
    }
    this_00 = (Variable *)
              __dynamic_cast(token,&lexer::token::Token::typeinfo,&lexer::token::Variable::typeinfo,
                             0);
    psVar2 = lexer::token::Variable::get_name_abi_cxx11_(this_00);
    std::
    make_unique<ninx::parser::element::FunctionArgument,std::__cxx11::string_const&,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>>
              (&this->origin,
               (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                *)psVar2);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
    return (__uniq_ptr_data<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>,_true,_true>
            )(__uniq_ptr_data<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>,_true,_true>
              )this;
  }
  this_01 = (ParserException *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            ((string *)&local_48,
             "Argument expected but not found. Maybe you forgot to prepend $ to the argument name?",
             (allocator *)local_50);
  exception::ParserException::ParserException(this_01,token,in_RSI,&local_48);
  __cxa_throw(this_01,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<FunctionArgument> ninx::parser::Parser::parse_function_argument() {
    auto raw_token{reader.get_token()};

    if (raw_token->get_type() != Type::VARIABLE) {
        throw ParserException(raw_token, this->origin, "Argument expected but not found. Maybe "
                                                       "you forgot to prepend $ to the argument"
                                                       " name?");
    }

    std::unique_ptr<Expression> default_value{nullptr};

    // Check if the argument does have a default value
    if (reader.check_limiter('=')) {
        reader.get_token();

        default_value = parse_expression();
    }

    auto argument_token{dynamic_cast<ninx::lexer::token::Variable *>(raw_token)};

    auto argument = std::make_unique<FunctionArgument>(argument_token->get_name(), std::move(default_value));

    return argument;
}